

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  ostream *poVar2;
  
  iVar1 = test1();
  if ((iVar1 == 0) && (iVar1 = test2(), iVar1 == 0)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Ok");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    return 0;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Fail ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 1;
}

Assistant:

int main()
{
	if(test1()==0 && test2()==0) {
		std::cout << "Ok" << std::endl;
		return EXIT_SUCCESS;
	}
	else {
		std::cout << "Fail " << std::endl;
		return EXIT_FAILURE;
	}
}